

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog_util.c
# Opt level: O0

int full_write(file_stream *strm,void *buf,size_t count)

{
  ssize_t sVar1;
  ulong in_RDX;
  void *in_RSI;
  int *in_RDI;
  ssize_t res;
  char *p;
  size_t local_48;
  void *local_28;
  ulong local_20;
  
  local_28 = in_RSI;
  local_20 = in_RDX;
  while( true ) {
    if (local_20 == 0) {
      return 0;
    }
    if (local_20 < 0x80000000) {
      local_48 = local_20;
    }
    else {
      local_48 = 0x7fffffff;
    }
    sVar1 = write(*in_RDI,local_28,local_48);
    if (sVar1 < 1) break;
    local_28 = (void *)(sVar1 + (long)local_28);
    local_20 = local_20 - sVar1;
  }
  msg_errno("Error writing to %s",*(undefined8 *)(in_RDI + 2));
  return -1;
}

Assistant:

int
full_write(struct file_stream *strm, const void *buf, size_t count)
{
	const char *p = buf;

	while (count != 0) {
		ssize_t res = write(strm->fd, p, MIN(count, INT_MAX));
		if (res <= 0) {
			msg_errno("Error writing to %"TS, strm->name);
			return -1;
		}
		p += res;
		count -= res;
	}
	return 0;
}